

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

ON_Object * __thiscall ON_AngularDimension2Extra::Internal_DeepCopy(ON_AngularDimension2Extra *this)

{
  ON_UserData *pOVar1;
  ON_UserData *this_00;
  
  this_00 = (ON_UserData *)operator_new(0xd8);
  ON_UserData::ON_UserData(this_00,&this->super_ON_UserData);
  (this_00->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_00810e10;
  pOVar1 = (ON_UserData *)this->m_dimpoint_offset[1];
  this_00[1].super_ON_Object._vptr_ON_Object = (_func_int **)this->m_dimpoint_offset[0];
  this_00[1].super_ON_Object.m_userdata_list = pOVar1;
  return &this_00->super_ON_Object;
}

Assistant:

ON_AngularDimension2Extra* ON_AngularDimension2Extra::AngularDimensionExtra(ON_OBSOLETE_V5_DimAngular* pDim)
{
  ON_AngularDimension2Extra* pExtra = 0;
  if(pDim)
  {
    pExtra = ON_AngularDimension2Extra::Cast(pDim->GetUserData(ON_CLASS_ID(ON_AngularDimension2Extra)));
    if(pExtra == 0)
    {
      pExtra = new ON_AngularDimension2Extra;
      if( pExtra)
      {
        if(!pDim->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = 0;
        }
      }
    }
  }
  return pExtra;
}